

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeI31Get(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,bool signed_)

{
  I31Get *pIVar1;
  bool bVar2;
  Ok local_a5;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  I31Get curr;
  bool signed__local;
  IRBuilder *this_local;
  
  pIVar1 = (I31Get *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  I31Get::I31Get(pIVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitI31Get
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pIVar1);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_70 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_a4 == 0) {
    pIVar1 = Builder::makeI31Get(&this->builder,
                                 (Expression *)
                                 curr.super_SpecificExpression<(wasm::Expression::Id)60>.
                                 super_Expression.type.id,signed_);
    push(this,(Expression *)pIVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeI31Get(bool signed_) {
  I31Get curr;
  CHECK_ERR(visitI31Get(&curr));
  push(builder.makeI31Get(curr.i31, signed_));
  return Ok{};
}